

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<double>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  unsafe_vector<idx_t> *puVar3;
  sel_t *psVar4;
  pointer puVar5;
  data_ptr_t pdVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  idx_t iVar9;
  idx_t b;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  
  if (chunk.start < chunk.end) {
    pdVar2 = (vector_data->format).data;
    puVar3 = info->offsets;
    do {
      iVar12 = chunk.start;
      if (chunk.has_result_index != false) {
        iVar12 = chunk.result_index;
      }
      psVar4 = ((vector_data->format).sel)->sel_vector;
      uVar11 = chunk.start;
      if (psVar4 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar4[chunk.start];
      }
      puVar5 = (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = info->result_data[iVar12];
      puVar7 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
        dVar1 = vector_data->valid_byte;
        uVar8 = puVar5[iVar12];
        puVar5[iVar12] = uVar8 + 1;
        pdVar6[uVar8] = dVar1;
        iVar9 = SortKeyConstantOperator<double>::Encode
                          (pdVar6 + puVar5[iVar12],*(TYPE_conflict2 *)(pdVar2 + uVar11 * 8));
        uVar10 = puVar5[iVar12];
        uVar11 = uVar10 + iVar9;
        if (info->flip_bytes == true) {
          for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
            pdVar6[uVar10] = ~pdVar6[uVar10];
            uVar11 = puVar5[iVar12] + iVar9;
          }
        }
        puVar5[iVar12] = uVar11;
      }
      else {
        dVar1 = vector_data->null_byte;
        uVar8 = puVar5[iVar12];
        puVar5[iVar12] = uVar8 + 1;
        pdVar6[uVar8] = dVar1;
      }
      chunk.start = chunk.start + 1;
    } while (chunk.start != chunk.end);
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}